

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::StringEnumeration::ensureCharsCapacity
          (StringEnumeration *this,int32_t capacity,UErrorCode *status)

{
  char *pcVar1;
  int iVar2;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  iVar2 = this->charsCapacity;
  if (iVar2 < capacity) {
    iVar2 = iVar2 / 2 + iVar2;
    if (iVar2 <= capacity) {
      iVar2 = capacity;
    }
    if (this->chars != this->charsBuffer) {
      uprv_free_63(this->chars);
    }
    pcVar1 = (char *)uprv_malloc_63((long)iVar2);
    this->chars = pcVar1;
    if (pcVar1 == (char *)0x0) {
      this->chars = this->charsBuffer;
      this->charsCapacity = 0x20;
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      this->charsCapacity = iVar2;
    }
  }
  return;
}

Assistant:

static
    inline UBool U_SUCCESS(UErrorCode code) { return (UBool)(code<=U_ZERO_ERROR); }